

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bool test_queue(void)

{
  ostream *poVar1;
  int iVar2;
  int in_ECX;
  nfds_t __nfds;
  nfds_t __nfds_00;
  nfds_t __nfds_01;
  nfds_t __nfds_02;
  pollfd *ppVar3;
  code *pcVar4;
  char *str;
  undefined1 local_28 [8];
  ArrayQueue queue;
  
  si9ma::ArrayQueue::ArrayQueue((ArrayQueue *)local_28,3);
  si9ma::ArrayQueue::push((ArrayQueue *)local_28,100);
  ppVar3 = (pollfd *)0x1e;
  si9ma::ArrayQueue::push((ArrayQueue *)local_28,0x1e);
  iVar2 = si9ma::ArrayQueue::poll((ArrayQueue *)local_28,ppVar3,__nfds,in_ECX);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  pcVar4 = std::endl<char,std::char_traits<char>>;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  iVar2 = si9ma::ArrayQueue::poll((ArrayQueue *)local_28,(pollfd *)pcVar4,__nfds_00,in_ECX);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  si9ma::ArrayQueue::push((ArrayQueue *)local_28,0x32);
  si9ma::ArrayQueue::push((ArrayQueue *)local_28,0x50);
  si9ma::ArrayQueue::push((ArrayQueue *)local_28,0x50);
  si9ma::ArrayQueue::push((ArrayQueue *)local_28,0x50);
  ppVar3 = (pollfd *)0x50;
  si9ma::ArrayQueue::push((ArrayQueue *)local_28,0x50);
  iVar2 = si9ma::ArrayQueue::poll((ArrayQueue *)local_28,ppVar3,__nfds_01,in_ECX);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  pcVar4 = std::endl<char,std::char_traits<char>>;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  iVar2 = si9ma::ArrayQueue::poll((ArrayQueue *)local_28,(pollfd *)pcVar4,__nfds_02,in_ECX);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  queue.tail._3_1_ = 1;
  si9ma::ArrayQueue::~ArrayQueue((ArrayQueue *)local_28);
  return (bool)(queue.tail._3_1_ & 1);
}

Assistant:

bool test_queue(){
    ArrayQueue queue(3);
    try {
        queue.push(100);
        queue.push(30);
        cout << queue.poll() << endl;
        cout << queue.poll() << endl;
        queue.push(50);
        queue.push(80);
        queue.push(80);
        queue.push(80);
        queue.push(80);
        cout << queue.poll() << endl;
        cout << queue.poll() << endl;
        return true;
    }catch (char const* str){
        cout << str << endl;
        return false;
    }
}